

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O3

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::DumpAndResetStats(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                    *this,char16 *filename)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar1 = this->totalBytesCommitted;
  if (sVar1 != 0) {
    sVar2 = this->totalBytesCode;
    sVar3 = this->totalBytesAlignment;
    Output::Print(L"Stats for %s: %s \n",this->name,filename);
    Output::Print(L"  Total code size      : %10d (%6.2f%% of committed)\n",
                  SUB84((double)(((float)this->totalBytesCode * 100.0) /
                                (float)this->totalBytesCommitted),0));
    Output::Print(L"  Total LoopBody code  : %10d\n",this->totalBytesLoopBody);
    uVar4 = sVar1 - (sVar2 + sVar3);
    Output::Print(L"  Total alignment size : %10d (%6.2f%% of committed)\n",
                  SUB84((double)(((float)this->totalBytesAlignment * 100.0) /
                                (float)this->totalBytesCommitted),0));
    Output::Print(L"  Total wasted size    : %10d (%6.2f%% of committed)\n",
                  SUB84((double)(((float)uVar4 * 100.0) / (float)this->totalBytesCommitted),0),uVar4
                 );
    Output::Print(L"  Total committed size : %10d (%6.2f%% of reserved)\n",
                  SUB84((double)(((float)this->totalBytesCommitted * 100.0) /
                                (float)this->totalBytesReserved),0));
    Output::Print(L"  Total reserved size  : %10d\n",this->totalBytesReserved);
  }
  this->totalBytesAlignment = 0;
  this->totalBytesCommitted = 0;
  this->totalBytesCode = 0;
  this->totalBytesLoopBody = 0;
  this->totalBytesReserved = 0;
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::DumpAndResetStats(char16 const * filename)
{
    if (this->totalBytesCommitted != 0)
    {
        size_t wasted = this->totalBytesCommitted - this->totalBytesCode - this->totalBytesAlignment;
        Output::Print(_u("Stats for %s: %s \n"), name, filename);
        Output::Print(_u("  Total code size      : %10d (%6.2f%% of committed)\n"), this->totalBytesCode,
            (float)this->totalBytesCode * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total LoopBody code  : %10d\n"), this->totalBytesLoopBody);
        Output::Print(_u("  Total alignment size : %10d (%6.2f%% of committed)\n"), this->totalBytesAlignment,
            (float)this->totalBytesAlignment * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total wasted size    : %10d (%6.2f%% of committed)\n"), wasted,
            (float)wasted * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total committed size : %10d (%6.2f%% of reserved)\n"), this->totalBytesCommitted,
            (float)this->totalBytesCommitted * 100 / this->totalBytesReserved);
        Output::Print(_u("  Total reserved size  : %10d\n"), this->totalBytesReserved);
    }
    this->totalBytesCode = 0;
    this->totalBytesLoopBody = 0;
    this->totalBytesAlignment = 0;
    this->totalBytesCommitted = 0;
    this->totalBytesReserved = 0;
}